

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5IterNextScan(Fts5IndexIter *pIndexIter)

{
  int iVar1;
  Fts5Index *p;
  Fts5IndexIter *pFVar2;
  ulong uVar3;
  
  p = (Fts5Index *)pIndexIter[1].iRowid;
  fts5MultiIterNext(p,(Fts5Iter *)pIndexIter,0,0);
  if (p->rc == 0) {
    uVar3 = (ulong)*(ushort *)(*(long *)&pIndexIter[3].nData + 4);
    if ((*(void **)&pIndexIter[uVar3 * 5 + 4].nData != (void *)0x0) &&
       (**(char **)&pIndexIter[uVar3 * 5 + 7].nData != '0')) {
      sqlite3_free(*(void **)&pIndexIter[uVar3 * 5 + 4].nData);
      pFVar2 = pIndexIter + uVar3 * 5 + 4;
      pFVar2->nData = 0;
      pFVar2->bEof = '\0';
      *(undefined3 *)&pFVar2->field_0x15 = 0;
      pIndexIter->bEof = '\x01';
    }
  }
  iVar1 = *(int *)(pIndexIter[1].iRowid + 0x34);
  *(undefined4 *)(pIndexIter[1].iRowid + 0x34) = 0;
  return iVar1;
}

Assistant:

static int sqlite3Fts5IterNextScan(Fts5IndexIter *pIndexIter){
  Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
  Fts5Index *p = pIter->pIndex;

  assert( pIter->pIndex->rc==SQLITE_OK );

  fts5MultiIterNext(p, pIter, 0, 0);
  if( p->rc==SQLITE_OK ){
    Fts5SegIter *pSeg = &pIter->aSeg[ pIter->aFirst[1].iFirst ];
    if( pSeg->pLeaf && pSeg->term.p[0]!=FTS5_MAIN_PREFIX ){
      fts5DataRelease(pSeg->pLeaf);
      pSeg->pLeaf = 0;
      pIter->base.bEof = 1;
    }
  }

  return fts5IndexReturn(pIter->pIndex);
}